

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void __thiscall
TElasticity3DAnalytic::TElasticity3DAnalytic(TElasticity3DAnalytic *this,TElasticity3DAnalytic *cp)

{
  (this->super_TPZAnalyticSolution)._vptr_TPZAnalyticSolution =
       (_func_int **)&PTR__TPZAnalyticSolution_01a08a80;
  (this->super_TPZAnalyticSolution).fSignConvention =
       (cp->super_TPZAnalyticSolution).fSignConvention;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "TPZAnalyticSolution::TPZAnalyticSolution(const TPZAnalyticSolution &cp): One should not invoke this copy constructor"
             ,0x74);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
             ,0xa6);
}

Assistant:

TElasticity3DAnalytic::TElasticity3DAnalytic(const TElasticity3DAnalytic &cp) : TPZAnalyticSolution(cp),fProblemType(cp.fProblemType),fE(cp.fE),fPoisson(cp.fPoisson) {
    std::cout << "TElasticity3DAnalytic::TElasticity3DAnalytic(const TElasticity3DAnalytic &cp): One should not invoke this copy constructor";
    DebugStop();
}